

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O1

void sorter_bubble_sort(int64_t *dst,size_t size)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  int64_t _sort_swap_temp;
  size_t n;
  
  if (size != 0) {
    do {
      if (size < 2) {
        uVar2 = 0;
      }
      else {
        uVar3 = 1;
        uVar2 = 0;
        do {
          lVar1 = dst[uVar3 - 1];
          if (dst[uVar3] < lVar1) {
            dst[uVar3 - 1] = dst[uVar3];
            dst[uVar3] = lVar1;
            uVar2 = uVar3;
          }
          uVar3 = uVar3 + 1;
        } while (size != uVar3);
      }
      size = uVar2;
    } while (uVar2 != 0);
  }
  return;
}

Assistant:

void BUBBLE_SORT(SORT_TYPE *dst, const size_t size) {
  size_t n = size;

  while (n) {
    size_t i, newn = 0U;

    for (i = 1U; i < n; ++i) {
      if (SORT_CMP(dst[i - 1U], dst[i]) > 0) {
        SORT_SWAP(dst[i - 1U], dst[i]);
        newn = i;
      }
    }

    n = newn;
  }
}